

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

bool phosg::pid_is_zombie(pid_t pid)

{
  int __fd;
  runtime_error *this;
  char *pcVar1;
  size_t sVar2;
  char *state;
  cannot_open_file *e;
  string local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  ssize_t local_850;
  ssize_t bytes_read;
  scoped_fd fd;
  undefined1 local_838 [8];
  string filename;
  char status_data [2048];
  bool local_9;
  pid_t pid_local;
  
  string_printf_abi_cxx11_((string *)local_838,"/proc/%d/status",(ulong)(uint)pid);
  scoped_fd::scoped_fd((scoped_fd *)&bytes_read,(string *)local_838,0,0x1ed);
  __fd = scoped_fd::operator_cast_to_int((scoped_fd *)&bytes_read);
  local_850 = ::read(__fd,(void *)((long)&filename.field_2 + 8),0x7ff);
  if (local_850 < 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::to_string(&local_890,pid);
    ::std::operator+(&local_870,"can\'t read stat file for pid ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_890
                    );
    ::std::runtime_error::runtime_error(this,(string *)&local_870);
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  status_data[local_850 + -8] = '\0';
  scoped_fd::~scoped_fd((scoped_fd *)&bytes_read);
  ::std::__cxx11::string::~string((string *)local_838);
  pcVar1 = strstr(filename.field_2._M_local_buf + 8,"\nState:");
  if (pcVar1 == (char *)0x0) {
    local_9 = false;
  }
  else {
    sVar2 = skip_whitespace(pcVar1 + 7,0);
    local_9 = pcVar1[sVar2 + 7] == 'Z';
  }
  return local_9;
}

Assistant:

bool pid_is_zombie(pid_t pid) {
  // so many syscalls... sigh
  char status_data[2048]; // this is probably big enough
  try {
    string filename = string_printf("/proc/%d/status", pid);
    scoped_fd fd(filename, O_RDONLY);
    ssize_t bytes_read = ::read(fd, status_data, 2047);
    if (bytes_read < 0) {
      throw runtime_error("can\'t read stat file for pid " + to_string(pid));
    }
    status_data[bytes_read] = '\0';
  } catch (const cannot_open_file& e) {
    return false; // non-running processes are not zombies
  }

  char* state = strstr(status_data, "\nState:");
  if (!state) {
    return false;
  }

  state += skip_whitespace(state + 7, 0) + 7; // +7 to skip over "\nState:"
  return (*state == 'Z');
}